

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

Filename * read_setting_filename(settings_r *handle,char *name)

{
  char *str;
  Filename *pFVar1;
  
  str = read_setting_s(handle,name);
  if (str == (char *)0x0) {
    pFVar1 = (Filename *)0x0;
  }
  else {
    pFVar1 = filename_from_str(str);
    safefree(str);
  }
  return pFVar1;
}

Assistant:

Filename *read_setting_filename(settings_r *handle, const char *name)
{
    char *tmp = read_setting_s(handle, name);
    if (tmp) {
        Filename *ret = filename_from_str(tmp);
        sfree(tmp);
        return ret;
    } else
        return NULL;
}